

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysections.cpp
# Opt level: O2

void DoSaveKeys(FConfigFile *config,char *section,FKeySection *keysection,bool dbl)

{
  undefined3 in_register_00000009;
  long lVar1;
  uint i;
  ulong uVar2;
  FKeyBindings *this;
  
  FConfigFile::SetSection(config,section,true);
  FConfigFile::ClearCurrentSection(config);
  if (CONCAT31(in_register_00000009,dbl) == 0) {
    this = &Bindings;
  }
  else {
    this = &DoubleBindings;
  }
  lVar1 = 8;
  for (uVar2 = 0; uVar2 < (keysection->mActions).Count; uVar2 = uVar2 + 1) {
    FKeyBindings::ArchiveBindings
              (this,config,*(char **)((long)&(((keysection->mActions).Array)->mTitle).Chars + lVar1)
              );
    lVar1 = lVar1 + 0x10;
  }
  return;
}

Assistant:

static void DoSaveKeys (FConfigFile *config, const char *section, FKeySection *keysection, bool dbl)
{
	config->SetSection (section, true);
	config->ClearCurrentSection ();
	FKeyBindings *bindings = dbl? &DoubleBindings : &Bindings;
	for (unsigned i = 0; i < keysection->mActions.Size(); ++i)
	{
		bindings->ArchiveBindings (config, keysection->mActions[i].mAction);
	}
}